

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O3

address __thiscall
pstore::transaction_base::allocate(transaction_base *this,uint64_t size,uint align)

{
  database *pdVar1;
  uint64_t uVar2;
  address aVar3;
  ulong uVar4;
  undefined4 in_register_00000014;
  undefined4 extraout_var;
  
  pdVar1 = this->db_;
  uVar2 = (pdVar1->size_).logical_;
  aVar3.a_._0_4_ = (*pdVar1->_vptr_database[4])(pdVar1,size,CONCAT44(in_register_00000014,align));
  aVar3.a_._4_4_ = extraout_var;
  if ((this->first_).a_ == 0) {
    if (this->size_ != 0) {
      raise<pstore::error_code>(cannot_allocate_after_commit);
    }
    (this->first_).a_ = aVar3.a_;
  }
  uVar4 = (pdVar1->size_).logical_ - uVar2;
  if (size <= uVar4) {
    this->size_ = this->size_ + uVar4;
    return (address)aVar3.a_;
  }
  assert_failed("bytes_allocated >= size",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/transaction.cpp"
                ,0x44);
}

Assistant:

address transaction_base::allocate (std::uint64_t const size, unsigned const align) {
        database & db = this->db ();
        auto const old_size = db.size ();
        address const result = db.allocate (size, align);
        if (first_ == address::null ()) {
            if (size_ != 0) {
                // Cannot allocate data after a transaction has been committed
                raise (error_code::cannot_allocate_after_commit);
            }
            first_ = result;
        }

        // Increase the transaction size by the actual number of bytes
        // allocated. This may be greater than the number requested to
        // allow for alignment.
        auto const bytes_allocated = db.size () - old_size;
        PSTORE_ASSERT (bytes_allocated >= size);
        size_ += bytes_allocated;
        return result;
    }